

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  char (*in_RDX) [2];
  char (*in_stack_ffffffffffffffa8) [2];
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  BaseTextGenerator *this_00;
  string *in_stack_ffffffffffffffb8;
  BaseTextGenerator *in_stack_ffffffffffffffc0;
  BaseTextGenerator local_38 [2];
  string *in_stack_ffffffffffffffd8;
  
  BaseTextGenerator::PrintLiteral<2ul>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = local_38;
  CEscape(in_stack_ffffffffffffffd8);
  BaseTextGenerator::PrintString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)local_38);
  BaseTextGenerator::PrintLiteral<2ul>(this_00,in_RDX);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  generator->PrintString(CEscape(val));
  generator->PrintLiteral("\"");
}